

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

string * __thiscall
rapid::Request::user_agent_abi_cxx11_(string *__return_storage_ptr__,Request *this)

{
  Environments *this_00;
  mapped_type *pmVar1;
  out_of_range *e;
  key_type local_48;
  Request *local_18;
  Request *this_local;
  
  local_18 = this;
  this_local = (Request *)__return_storage_ptr__;
  this_00 = environments_abi_cxx11_(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"USER_AGENT",(allocator *)((long)&e + 7));
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,&local_48);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  return __return_storage_ptr__;
}

Assistant:

std::string Request::user_agent() const {
  try {
    return environments().at("USER_AGENT");
  } catch (std::out_of_range &e) {
    return "";
  }
}